

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O0

wchar_t zip_read_data_none(archive_read *a,void **_buff,size_t *size,int64_t *offset)

{
  int iVar1;
  uint32_t uVar2;
  wchar_t wVar3;
  size_t local_78;
  size_t dsize;
  size_t dec_size;
  ssize_t grabbing_bytes;
  char *p;
  long lStack_50;
  wchar_t r;
  ssize_t trailing_extra;
  ssize_t bytes_avail;
  char *buff;
  zip *zip;
  int64_t *offset_local;
  size_t *size_local;
  void **_buff_local;
  archive_read *a_local;
  
  buff = (char *)a->format->data;
  iVar1 = 0;
  if (buff[0x1f98] != '\0') {
    iVar1 = 10;
  }
  lStack_50 = (long)iVar1;
  zip = (zip *)offset;
  offset_local = (int64_t *)size;
  size_local = (size_t *)_buff;
  _buff_local = (void **)a;
  if ((*(ushort *)(*(long *)(buff + 0x70) + 0x7e) & 8) == 0) {
    if (*(long *)(buff + 0x78) == 0) {
      buff[0xa2] = '\x01';
      if ((buff[0x1f98] != '\0') &&
         (wVar3 = check_authentication_code(a,(void *)0x0), wVar3 != L'\0')) {
        return wVar3;
      }
      return L'\0';
    }
    bytes_avail = (ssize_t)__archive_read_ahead(a,1,&trailing_extra);
    if (trailing_extra < 1) {
      archive_set_error((archive *)_buff_local,0x54,"Truncated ZIP file data");
      return L'\xffffffe2';
    }
    if (*(long *)(buff + 0x78) < trailing_extra) {
      trailing_extra = *(ssize_t *)(buff + 0x78);
    }
  }
  else {
    dec_size = lStack_50 + 0x18;
    bytes_avail = (ssize_t)__archive_read_ahead(a,dec_size,&trailing_extra);
    if (trailing_extra < (long)dec_size) {
      archive_set_error((archive *)_buff_local,0x54,"Truncated ZIP file data");
      return L'\xffffffe2';
    }
    grabbing_bytes = bytes_avail + lStack_50;
    if (((((*(char *)grabbing_bytes == 'P') && (*(char *)(grabbing_bytes + 1) == 'K')) &&
         (*(char *)(grabbing_bytes + 2) == '\a')) && (*(char *)(grabbing_bytes + 3) == '\b')) &&
       (((uVar2 = archive_le32dec((char *)(grabbing_bytes + 4)),
         (ulong)uVar2 == *(ulong *)(buff + 0x90) || (buff[0xa0] != '\0')) ||
        ((buff[0x1f98] != '\0' && (*(int *)(*(long *)(buff + 0x70) + 0x84) == 2)))))) {
      buff[0xa2] = '\x01';
      if ((buff[0x1f98] != '\0') &&
         (wVar3 = check_authentication_code((archive_read *)_buff_local,(void *)bytes_avail),
         wVar3 != L'\0')) {
        return wVar3;
      }
      return L'\0';
    }
    grabbing_bytes = grabbing_bytes + 1;
    while ((ulong)grabbing_bytes < (bytes_avail + trailing_extra) - 4U) {
      if (*(char *)(grabbing_bytes + 3) == 'P') {
        grabbing_bytes = grabbing_bytes + 3;
      }
      else if (*(char *)(grabbing_bytes + 3) == 'K') {
        grabbing_bytes = grabbing_bytes + 2;
      }
      else if (*(char *)(grabbing_bytes + 3) == '\a') {
        grabbing_bytes = grabbing_bytes + 1;
      }
      else {
        if ((((*(char *)(grabbing_bytes + 3) == '\b') && (*(char *)(grabbing_bytes + 2) == '\a')) &&
            (*(char *)(grabbing_bytes + 1) == 'K')) && (*(char *)grabbing_bytes == 'P')) break;
        grabbing_bytes = grabbing_bytes + 4;
      }
    }
    grabbing_bytes = grabbing_bytes - lStack_50;
    trailing_extra = grabbing_bytes - bytes_avail;
  }
  if ((buff[0x1f2c] != '\0') || (buff[0x1f88] != '\0')) {
    dsize = trailing_extra;
    if (*(ulong *)(buff + 0x1f08) < (ulong)trailing_extra) {
      dsize = *(size_t *)(buff + 0x1f08);
    }
    if (buff[0x1f2c] == '\0') {
      local_78 = dsize;
      __hmac_sha1_update((archive_hmac_sha1_ctx *)(buff + 0x1f90),(uint8_t *)bytes_avail,dsize);
      aes_ctr_update((archive_crypto_ctx *)(buff + 0x1f30),(uint8_t *)bytes_avail,dsize,
                     *(uint8_t **)(buff + 0x1ef8),&local_78);
    }
    else {
      trad_enc_decrypt_update
                ((trad_enc_ctx *)(buff + 0x1f20),(uint8_t *)bytes_avail,dsize,
                 *(uint8_t **)(buff + 0x1ef8),dsize);
    }
    trailing_extra = dsize;
    bytes_avail = *(ssize_t *)(buff + 0x1ef8);
  }
  *(long *)(buff + 0x78) = *(long *)(buff + 0x78) - trailing_extra;
  *(ssize_t *)(buff + 0x88) = trailing_extra + *(long *)(buff + 0x88);
  *(ssize_t *)(buff + 0x80) = trailing_extra + *(long *)(buff + 0x80);
  *(ssize_t *)(buff + 0x68) = trailing_extra + *(long *)(buff + 0x68);
  *offset_local = trailing_extra;
  *size_local = bytes_avail;
  return L'\0';
}

Assistant:

static int
zip_read_data_none(struct archive_read *a, const void **_buff,
    size_t *size, int64_t *offset)
{
	struct zip *zip;
	const char *buff;
	ssize_t bytes_avail;
	ssize_t trailing_extra;
	int r;

	(void)offset; /* UNUSED */

	zip = (struct zip *)(a->format->data);
	trailing_extra = zip->hctx_valid ? AUTH_CODE_SIZE : 0;

	if (zip->entry->zip_flags & ZIP_LENGTH_AT_END) {
		const char *p;
		ssize_t grabbing_bytes = 24 + trailing_extra;

		/* Grab at least 24 bytes. */
		buff = __archive_read_ahead(a, grabbing_bytes, &bytes_avail);
		if (bytes_avail < grabbing_bytes) {
			/* Zip archives have end-of-archive markers
			   that are longer than this, so a failure to get at
			   least 24 bytes really does indicate a truncated
			   file. */
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Truncated ZIP file data");
			return (ARCHIVE_FATAL);
		}
		/* Check for a complete PK\007\010 signature, followed
		 * by the correct 4-byte CRC. */
		p = buff + trailing_extra;
		if (p[0] == 'P' && p[1] == 'K'
		    && p[2] == '\007' && p[3] == '\010'
		    && (archive_le32dec(p + 4) == zip->computed_crc32
			|| zip->ignore_crc32
			|| (zip->hctx_valid
			 && zip->entry->aes_extra.vendor == AES_VENDOR_AE_2))) {
			zip->end_of_entry = 1;
			if (zip->hctx_valid) {
				r = check_authentication_code(a, buff);
				if (r != ARCHIVE_OK)
					return (r);
			}
			return (ARCHIVE_OK);
		}
		/* If not at EOF, ensure we consume at least one byte. */
		++p;

		/* Scan forward until we see where a PK\007\010 signature
		 * might be. */
		/* Return bytes up until that point.  On the next call,
		 * the code above will verify the data descriptor. */
		while (p < buff + bytes_avail - 4) {
			if (p[3] == 'P') { p += 3; }
			else if (p[3] == 'K') { p += 2; }
			else if (p[3] == '\007') { p += 1; }
			else if (p[3] == '\010' && p[2] == '\007'
			    && p[1] == 'K' && p[0] == 'P') {
				break;
			} else { p += 4; }
		}
		p -= trailing_extra;
		bytes_avail = p - buff;
	} else {
		if (zip->entry_bytes_remaining == 0) {
			zip->end_of_entry = 1;
			if (zip->hctx_valid) {
				r = check_authentication_code(a, NULL);
				if (r != ARCHIVE_OK)
					return (r);
			}
			return (ARCHIVE_OK);
		}
		/* Grab a bunch of bytes. */
		buff = __archive_read_ahead(a, 1, &bytes_avail);
		if (bytes_avail <= 0) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Truncated ZIP file data");
			return (ARCHIVE_FATAL);
		}
		if (bytes_avail > zip->entry_bytes_remaining)
			bytes_avail = (ssize_t)zip->entry_bytes_remaining;
	}
	if (zip->tctx_valid || zip->cctx_valid) {
		size_t dec_size = bytes_avail;

		if (dec_size > zip->decrypted_buffer_size)
			dec_size = zip->decrypted_buffer_size;
		if (zip->tctx_valid) {
			trad_enc_decrypt_update(&zip->tctx,
			    (const uint8_t *)buff, dec_size,
			    zip->decrypted_buffer, dec_size);
		} else {
			size_t dsize = dec_size;
			archive_hmac_sha1_update(&zip->hctx,
			    (const uint8_t *)buff, dec_size);
			archive_decrypto_aes_ctr_update(&zip->cctx,
			    (const uint8_t *)buff, dec_size,
			    zip->decrypted_buffer, &dsize);
		}
		bytes_avail = dec_size;
		buff = (const char *)zip->decrypted_buffer;
	}
	zip->entry_bytes_remaining -= bytes_avail;
	zip->entry_uncompressed_bytes_read += bytes_avail;
	zip->entry_compressed_bytes_read += bytes_avail;
	zip->unconsumed += bytes_avail;
	*size = bytes_avail;
	*_buff = buff;
	return (ARCHIVE_OK);
}